

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O1

double highwayhash::InvariantTicksPerSecond(void)

{
  int iVar1;
  
  if (NominalClockRate()::cycles_per_second == '\0') {
    iVar1 = __cxa_guard_acquire(&NominalClockRate()::cycles_per_second);
    if (iVar1 != 0) {
      NominalClockRate::cycles_per_second = anon_unknown_5::DetectNominalClockRate();
      __cxa_guard_release(&NominalClockRate()::cycles_per_second);
    }
  }
  return NominalClockRate::cycles_per_second;
}

Assistant:

double InvariantTicksPerSecond() {
#if HH_ARCH_PPC
#if __GLIBC__
  static const double cycles_per_second = __ppc_get_timebase_freq();
#elif __FreeBSD__
  double cycles_per_second = 0;
  size_t length = sizeof(cycles_per_second);
  sysctlbyname("kern.timecounter.tc.timebase.frequency", &cycles_per_second,
               &length, NULL, 0);
#elif __OpenBSD__
  /* There is currently no method of retrieving this via userland.
   * This value is correct for Power8 and Power9.
   */
  static const double cycles_per_second = 512000000;
#endif
  return cycles_per_second;
#else
  return NominalClockRate();
#endif
}